

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O3

REF_STATUS ref_subdiv_split_pri(REF_SUBDIV ref_subdiv)

{
  size_t __size;
  REF_CELL ref_cell;
  uint uVar1;
  uint map;
  REF_STATUS RVar2;
  void *__s;
  ulong uVar3;
  undefined8 uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  REF_INT new_cell;
  REF_CELL ref_cell_split;
  REF_INT nodes [27];
  REF_INT new_nodes [27];
  REF_INT local_124;
  REF_CELL local_120;
  REF_INT local_118;
  REF_INT local_114;
  REF_INT local_110;
  REF_INT local_10c;
  REF_INT local_108;
  REF_INT local_104;
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c;
  REF_INT local_98;
  REF_INT local_94 [25];
  
  ref_cell = ref_subdiv->grid->cell[10];
  iVar5 = ref_cell->max;
  if ((long)iVar5 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x586,
           "ref_subdiv_split_pri","malloc marked_for_removal of REF_INT negative");
    uVar1 = 1;
  }
  else {
    __size = (long)iVar5 * 4;
    __s = malloc(__size);
    if (__s == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x586,"ref_subdiv_split_pri","malloc marked_for_removal of REF_INT NULL");
      uVar1 = 2;
    }
    else {
      if (iVar5 != 0) {
        memset(__s,0,__size);
      }
      uVar1 = ref_cell_create(&local_120,ref_cell->type);
      if (uVar1 == 0) {
        if (0 < ref_cell->max) {
          uVar7 = 0;
          do {
            iVar5 = (int)uVar7;
            if (ref_cell->c2n[(long)iVar5 * (long)ref_cell->size_per] != -1) {
              map = ref_subdiv_map(ref_subdiv,ref_cell,iVar5);
              uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_118);
              if (uVar1 != 0) {
                pcVar6 = "nodes";
                uVar4 = 0x58b;
                goto LAB_001ee7db;
              }
              if ((int)map < 0x82) {
                if (map != 0) {
                  if (map == 0x34) {
                    *(undefined4 *)((long)__s + uVar7 * 4) = 1;
                    uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_a8);
                    if (uVar1 != 0) {
                      pcVar6 = "nodes";
                      uVar4 = 0x592;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_subdiv_node_between(ref_subdiv,local_118,local_10c,&local_a8);
                    if (uVar1 != 0) {
                      pcVar6 = "mis";
                      uVar4 = 0x595;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_subdiv_node_between(ref_subdiv,local_114,local_108,&local_a4);
                    if (uVar1 != 0) {
                      pcVar6 = "mis";
                      uVar4 = 0x598;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_subdiv_node_between(ref_subdiv,local_110,local_104,&local_a0);
                    if (uVar1 != 0) {
                      pcVar6 = "mis";
                      uVar4 = 0x59b;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_cell_add(local_120,&local_a8,&local_124);
                    if (uVar1 != 0) {
                      pcVar6 = "add";
                      uVar4 = 0x59c;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_a8);
                    if (uVar1 != 0) {
                      pcVar6 = "nodes";
                      uVar4 = 0x59e;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_subdiv_node_between(ref_subdiv,local_118,local_10c,&local_9c);
                    if (uVar1 != 0) {
                      pcVar6 = "mis";
                      uVar4 = 0x5a1;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_subdiv_node_between(ref_subdiv,local_114,local_108,&local_98);
                    if (uVar1 != 0) {
                      pcVar6 = "mis";
                      uVar4 = 0x5a4;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_subdiv_node_between(ref_subdiv,local_110,local_104,local_94);
                    if (uVar1 != 0) {
                      pcVar6 = "mis";
                      uVar4 = 0x5a7;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_cell_add(local_120,&local_a8,&local_124);
                    if (uVar1 != 0) {
                      pcVar6 = "add";
                      uVar4 = 0x5a8;
                      goto LAB_001ee7db;
                    }
                  }
                  else {
                    if (map != 0x41) {
LAB_001ef11b:
                      ref_subdiv_map_to_edge(map);
                      printf("pri %d, map %d\n",uVar7 & 0xffffffff,(ulong)map);
                      pcVar6 = "map not implemented yet";
                      uVar1 = 6;
                      uVar4 = 0x636;
                      uVar7 = 6;
                      goto LAB_001ee7de;
                    }
                    *(undefined4 *)((long)__s + uVar7 * 4) = 1;
                    uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_a8);
                    if (uVar1 != 0) {
                      pcVar6 = "nodes";
                      uVar4 = 0x5ad;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a8);
                    if (uVar1 != 0) {
                      pcVar6 = "mis";
                      uVar4 = 0x5b0;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_subdiv_node_between(ref_subdiv,local_10c,local_108,&local_9c);
                    if (uVar1 != 0) {
                      pcVar6 = "mis";
                      uVar4 = 0x5b3;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_cell_add(local_120,&local_a8,&local_124);
                    if (uVar1 != 0) {
                      pcVar6 = "add";
                      uVar4 = 0x5b4;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_a8);
                    if (uVar1 != 0) {
                      pcVar6 = "nodes";
                      uVar4 = 0x5b6;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a4);
                    if (uVar1 != 0) {
                      pcVar6 = "mis";
                      uVar4 = 0x5b9;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_subdiv_node_between(ref_subdiv,local_10c,local_108,&local_98);
                    if (uVar1 != 0) {
                      pcVar6 = "mis";
                      uVar4 = 0x5bc;
                      goto LAB_001ee7db;
                    }
                    uVar1 = ref_cell_add(local_120,&local_a8,&local_124);
                    if (uVar1 != 0) {
                      pcVar6 = "add";
                      uVar4 = 0x5bd;
                      goto LAB_001ee7db;
                    }
                  }
                }
              }
              else if (map == 0x82) {
                *(undefined4 *)((long)__s + uVar7 * 4) = 1;
                uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_a8);
                if (uVar1 != 0) {
                  pcVar6 = "nodes";
                  uVar4 = 0x5c2;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_118,local_110,&local_a8);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x5c5;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_10c,local_104,&local_9c);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x5c8;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_cell_add(local_120,&local_a8,&local_124);
                if (uVar1 != 0) {
                  pcVar6 = "add";
                  uVar4 = 0x5c9;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_a8);
                if (uVar1 != 0) {
                  pcVar6 = "nodes";
                  uVar4 = 0x5cb;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_118,local_110,&local_a0);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x5ce;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_10c,local_104,local_94);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x5d1;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_cell_add(local_120,&local_a8,&local_124);
                if (uVar1 != 0) {
                  pcVar6 = "add";
                  uVar4 = 0x5d2;
                  goto LAB_001ee7db;
                }
              }
              else if (map == 0x108) {
                *(undefined4 *)((long)__s + uVar7 * 4) = 1;
                uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_a8);
                if (uVar1 != 0) {
                  pcVar6 = "nodes";
                  uVar4 = 0x5d7;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a4);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x5da;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_108,local_104,&local_98);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x5dd;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_cell_add(local_120,&local_a8,&local_124);
                if (uVar1 != 0) {
                  pcVar6 = "add";
                  uVar4 = 0x5de;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_a8);
                if (uVar1 != 0) {
                  pcVar6 = "nodes";
                  uVar4 = 0x5e0;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a0);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x5e3;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_108,local_104,local_94);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x5e6;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_cell_add(local_120,&local_a8,&local_124);
                if (uVar1 != 0) {
                  pcVar6 = "add";
                  uVar4 = 0x5e7;
                  goto LAB_001ee7db;
                }
              }
              else {
                if (map != 0x1cb) goto LAB_001ef11b;
                *(undefined4 *)((long)__s + uVar7 * 4) = 1;
                uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_a8);
                if (uVar1 != 0) {
                  pcVar6 = "nodes";
                  uVar4 = 0x5ed;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a4);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x5f0;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_118,local_110,&local_a0);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x5f3;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_10c,local_108,&local_98);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x5f6;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_10c,local_104,local_94);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x5f9;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_cell_add(local_120,&local_a8,&local_124);
                if (uVar1 != 0) {
                  pcVar6 = "add";
                  uVar4 = 0x5fa;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_a8);
                if (uVar1 != 0) {
                  pcVar6 = "nodes";
                  uVar4 = 0x5fd;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_114,local_118,&local_a8);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x600;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a0);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x603;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_108,local_10c,&local_9c);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x606;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_108,local_104,local_94);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x609;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_cell_add(local_120,&local_a8,&local_124);
                if (uVar1 != 0) {
                  pcVar6 = "add";
                  uVar4 = 0x60a;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_cell_nodes(ref_cell,iVar5,&local_a8);
                if (uVar1 != 0) {
                  pcVar6 = "nodes";
                  uVar4 = 0x60d;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_110,local_114,&local_a4);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x610;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_110,local_118,&local_a8);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x613;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_104,local_108,&local_98);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x616;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_104,local_10c,&local_9c);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x619;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_cell_add(local_120,&local_a8,&local_124);
                if (uVar1 != 0) {
                  pcVar6 = "add";
                  uVar4 = 0x61a;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_118,local_114,&local_a8);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x61f;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_114,local_110,&local_a4);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x622;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_110,local_118,&local_a0);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x625;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_10c,local_108,&local_9c);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x629;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_108,local_104,&local_98);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x62c;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_subdiv_node_between(ref_subdiv,local_104,local_10c,local_94);
                if (uVar1 != 0) {
                  pcVar6 = "mis";
                  uVar4 = 0x62f;
                  goto LAB_001ee7db;
                }
                uVar1 = ref_cell_add(local_120,&local_a8,&local_124);
                if (uVar1 != 0) {
                  pcVar6 = "add";
                  uVar4 = 0x630;
                  goto LAB_001ee7db;
                }
              }
            }
            uVar7 = uVar7 + 1;
            uVar3 = (ulong)ref_cell->max;
          } while ((long)uVar7 < (long)uVar3);
          if (0 < ref_cell->max) {
            lVar8 = 0;
            do {
              if (*(int *)((long)__s + lVar8 * 4) == 1) {
                uVar1 = ref_cell_remove(ref_cell,(REF_INT)lVar8);
                if (uVar1 != 0) {
                  pcVar6 = "remove";
                  uVar4 = 0x63c;
                  goto LAB_001ee7db;
                }
                uVar3 = (ulong)(uint)ref_cell->max;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < (int)uVar3);
          }
        }
        if (0 < local_120->max) {
          iVar5 = 0;
          do {
            RVar2 = ref_cell_nodes(local_120,iVar5,&local_118);
            if ((RVar2 == 0) &&
               (uVar1 = ref_subdiv_add_local_cell((REF_SUBDIV)ref_subdiv->grid,ref_cell,&local_118),
               uVar1 != 0)) {
              pcVar6 = "add local";
              uVar4 = 0x63f;
              goto LAB_001ee7db;
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 < local_120->max);
        }
        uVar1 = ref_cell_free(local_120);
        if (uVar1 == 0) {
          free(__s);
          return 0;
        }
        pcVar6 = "temp ref_cell free";
        uVar4 = 0x641;
      }
      else {
        pcVar6 = "temp cell";
        uVar4 = 0x588;
      }
LAB_001ee7db:
      uVar7 = (ulong)uVar1;
LAB_001ee7de:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             uVar4,"ref_subdiv_split_pri",uVar7,pcVar6);
    }
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_pri(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL ref_cell;
  REF_CELL ref_cell_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT map;

  ref_cell = ref_grid_pri(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(ref_cell), REF_INT, 0);

  RSS(ref_cell_create(&ref_cell_split, ref_cell_type(ref_cell)), "temp cell");
  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    switch (map) {
      case 0: /* don't split */
        break;
      case 52: /* prism split top and bottom, edges 2,4,5 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[4],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[5],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
        break;
      case 65: /* prism split edges 0, 6 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
        break;
      case 130: /* prism split edges 1, 7 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[5],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
        break;
      case 264: /* prism split edges 3, 8 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[5],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
        break;
      case 459: /* prism split */
        marked_for_removal[cell] = 1;

        /* near edge 0-3 */
        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* near edge 1-4 */
        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[3],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* near edge 2-5 */
        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[5], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[5], nodes[3],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* center */
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[2])),
            "mis");

        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[5],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[5], nodes[3],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("pri %d, map %d\n", cell, map);
        RSS(REF_IMPLEMENT, "map not implemented yet")
    }
  }

  for (cell = 0; cell < ref_cell_max(ref_cell); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(ref_cell, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(ref_cell_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, ref_cell, nodes), "add local");

  RSS(ref_cell_free(ref_cell_split), "temp ref_cell free");
  free(marked_for_removal);

  return REF_SUCCESS;
}